

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O3

void check_tris(tri_cc_t *te)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  pointer ptVar5;
  pointer piVar6;
  ostream *poVar7;
  runtime_error *this;
  int iVar8;
  long lVar9;
  uint t;
  vector<int,_std::allocator<int>_> vert_tri_ct;
  stringstream ss;
  vector<int,_std::allocator<int>_> local_1f0;
  allocator_type local_1d8 [32];
  value_type_conflict2 local_1b8 [4];
  ostream local_1a8 [376];
  
  local_1b8[0] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1f0,
             (long)(int)((ulong)((long)(te->m_verts).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(te->m_verts).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2),local_1b8,
             local_1d8);
  ptVar5 = (te->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(te->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ptVar5;
  if (lVar9 != 0) {
    lVar9 = (lVar9 >> 2) * -0x5555555555555555;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    do {
      local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[ptVar5->v] =
           local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[ptVar5->v] + 1;
      ptVar5 = ptVar5 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  piVar6 = (te->m_verts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(te->m_verts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar6) >> 2) < 1) {
    if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    lVar9 = 0;
    do {
      uVar1 = piVar6[lVar9];
      uVar4 = uVar1;
      iVar2 = 1;
      do {
        iVar8 = iVar2;
        t = uVar4 + ((uVar4 + 2) / 3) * -3 + 2 + (uVar4 / 3) * 3;
        bVar3 = tri_cc_t::has_fnext(te,t);
        if (!bVar3) break;
        uVar4 = tri_cc_t::fnext(te,t);
        iVar2 = iVar8 + 1;
      } while (uVar4 != uVar1);
      if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] != iVar8) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Failed to ensure condition ",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"t_no == vert_tri_ct[i]",0x16);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                   ,0x60);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"check_tris",10);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
        poVar7 = (ostream *)std::ostream::operator<<(local_1a8,0x2c9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") \n ",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Non manifold vertex found",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"i",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar9);
        std::endl<char,std::char_traits<char>>(poVar7);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this,(string *)local_1d8);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar9 = lVar9 + 1;
      piVar6 = (te->m_verts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(te->m_verts).super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar6)
                          >> 2));
  }
  operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void check_tris(const tri_cc_t &te)
{
  vector<int> vert_tri_ct(te.vert_ct(),0);

  for( int i = 0 ; i < te.m_tris.size(); ++i)
  {
    vert_tri_ct[te.m_tris[i].v]++;
  }

  for( int i = 0 ; i < te.vert_ct(); ++i)
  {
    int tstart = te.m_verts[i],t = tstart,t_no = 0;

    do
    {
      t_no++;
      t = eprev(t);
      if (!te.has_fnext(t)) break;
      t = te.fnext(t);
    } while(t != tstart);

    ENSURES(t_no == vert_tri_ct[i])
        << "Non manifold vertex found"
        << STRMVAR(i)
        << endl;
  }
}